

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O1

void __thiscall TPZSBMatrix<double>::TPZSBMatrix(TPZSBMatrix<double> *this,int64_t dim,int64_t band)

{
  long lVar1;
  
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = dim;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = dim;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSBMatrix_0188dc90;
  (this->fDiag)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fDiag).fStore = (double *)0x0;
  (this->fDiag).fNElements = 0;
  lVar1 = dim + -1;
  if (band <= dim + -1) {
    lVar1 = band;
  }
  (this->fDiag).fNAlloc = 0;
  this->fBand = lVar1;
  TPZVec<double>::Resize(&this->fDiag,dim * (lVar1 + 1));
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (this);
  return;
}

Assistant:

TPZSBMatrix<TVar>::TPZSBMatrix( int64_t dim, int64_t band )
: TPZRegisterClassId(&TPZSBMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    fBand = ( band > (dim - 1) ? (dim - 1) : band );
    fDiag.resize(Size());
    
    Zero();
}